

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t icu_63::spanOneUTF8(UnicodeSet *set,uint8_t *s,int32_t length)

{
  UBool UVar1;
  uint uVar2;
  uint c;
  uint uVar3;
  byte bVar4;
  
  bVar4 = *s;
  uVar2 = (uint)bVar4;
  if (-1 < (char)bVar4) {
    UVar1 = UnicodeSet::contains(set,uVar2);
    return -(uint)(UVar1 == '\0') | 1;
  }
  uVar3 = 1;
  c = 0xfffd;
  if (length == 1) goto LAB_002c95fc;
  if (bVar4 < 0xe0) {
    if (bVar4 < 0xc2) goto LAB_002c95fc;
    uVar2 = uVar2 & 0x1f;
  }
  else {
    if (bVar4 < 0xf0) {
      uVar2 = uVar2 & 0xf;
      if (((byte)" 000000000000\x1000"[uVar2] >> (s[1] >> 5) & 1) == 0) goto LAB_002c95fc;
      bVar4 = s[1] & 0x3f;
      uVar3 = 2;
    }
    else {
      if (0xf4 < bVar4) goto LAB_002c95fc;
      if (((((uint)(int)""[s[1] >> 4] >> (uVar2 - 0xf0 & 0x1f) & 1) == 0) ||
          (uVar3 = 2, length == 2)) || (bVar4 = s[2] + 0x80, 0x3f < bVar4)) goto LAB_002c95fc;
      uVar2 = s[1] & 0x3f | (uVar2 - 0xf0) * 0x40;
      uVar3 = 3;
    }
    if (uVar3 == length) goto LAB_002c95fc;
    uVar2 = (uint)bVar4 | uVar2 << 6;
  }
  if ((byte)(s[uVar3] ^ 0x80) < 0x40) {
    c = uVar2 << 6 | s[uVar3] ^ 0x80;
    uVar3 = uVar3 + 1;
  }
LAB_002c95fc:
  UVar1 = UnicodeSet::contains(set,c);
  uVar2 = -uVar3;
  if (UVar1 != '\0') {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

static inline int32_t
spanOneUTF8(const UnicodeSet &set, const uint8_t *s, int32_t length) {
    UChar32 c=*s;
    if(U8_IS_SINGLE(c)) {
        return set.contains(c) ? 1 : -1;
    }
    // Take advantage of non-ASCII fastpaths in U8_NEXT_OR_FFFD().
    int32_t i=0;
    U8_NEXT_OR_FFFD(s, i, length, c);
    return set.contains(c) ? i : -i;
}